

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

WildcardPattern * __thiscall Catch::WildcardPattern::adjustCase(WildcardPattern *this,string *str)

{
  string *in_RDX;
  string *str_local;
  WildcardPattern *this_local;
  
  if (*(int *)(str + 8) == 1) {
    toLower((Catch *)this,in_RDX);
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)in_RDX);
  }
  return this;
}

Assistant:

std::string adjustCase( std::string const& str ) const {
            return m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str;
        }